

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O0

TypedefNameType * __thiscall
psy::C::DeclarationBinder::makeType<psy::C::TypedefNameType,psy::C::Identifier_const*>
          (DeclarationBinder *this,Identifier *args)

{
  SemanticModel *this_00;
  TypedefNameType *this_01;
  Type *pTVar1;
  unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> local_38 [3];
  unique_ptr<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>_> local_20;
  unique_ptr<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>_> ty;
  Identifier *args_local;
  DeclarationBinder *this_local;
  
  ty._M_t.
  super___uniq_ptr_impl<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>_>._M_t
  .super__Tuple_impl<0UL,_psy::C::TypedefNameType_*,_std::default_delete<psy::C::TypedefNameType>_>.
  super__Head_base<0UL,_psy::C::TypedefNameType_*,_false>._M_head_impl =
       (__uniq_ptr_data<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>,_true,_true>
        )(__uniq_ptr_data<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>,_true,_true>
          )args;
  this_01 = (TypedefNameType *)operator_new(0x10);
  TypedefNameType::TypedefNameType
            (this_01,(Identifier *)
                     ty._M_t.
                     super___uniq_ptr_impl<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_psy::C::TypedefNameType_*,_std::default_delete<psy::C::TypedefNameType>_>
                     .super__Head_base<0UL,_psy::C::TypedefNameType_*,_false>._M_head_impl);
  std::unique_ptr<psy::C::TypedefNameType,std::default_delete<psy::C::TypedefNameType>>::
  unique_ptr<std::default_delete<psy::C::TypedefNameType>,void>
            ((unique_ptr<psy::C::TypedefNameType,std::default_delete<psy::C::TypedefNameType>> *)
             &local_20,this_01);
  this_00 = this->semaModel_;
  std::unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>>::
  unique_ptr<psy::C::TypedefNameType,std::default_delete<psy::C::TypedefNameType>,void>
            ((unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>> *)local_38,&local_20);
  pTVar1 = SemanticModel::keepType(this_00,local_38);
  std::unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_>::~unique_ptr(local_38);
  std::unique_ptr<psy::C::TypedefNameType,_std::default_delete<psy::C::TypedefNameType>_>::
  ~unique_ptr(&local_20);
  return (TypedefNameType *)pTVar1;
}

Assistant:

TyT* DeclarationBinder::makeType(TyTArgs... args)
{
    std::unique_ptr<TyT> ty(new TyT(std::forward<TyTArgs>(args)...));
    return static_cast<TyT*>(semaModel_->keepType(std::move(ty)));
}